

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

Vec_Int_t * Dau_DecFindSets_int(word *pInit,int nVars,int **pSched)

{
  int v;
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint uMaskS;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  uint uVar16;
  uint Entry;
  uint uVar17;
  int pVarsB [16];
  int P2V [16];
  int V2P [16];
  word p [1024];
  uint local_212c;
  ulong local_2120;
  char local_20f8 [64];
  int local_20b8 [16];
  int local_2078 [16];
  ulong local_2038 [1025];
  
  uVar15 = (ulong)(uint)nVars;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x20;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(0x80);
  uVar6 = 1 << ((byte)nVars & 0x1f);
  iVar8 = nVars + -6;
  bVar5 = (byte)iVar8 & 0x1f;
  uVar16 = 1 << bVar5;
  p_00->pArray = piVar2;
  uVar17 = uVar16;
  if (nVars < 7) {
    uVar17 = 1;
  }
  memcpy(local_2038,pInit,(long)(int)uVar17 << 3);
  if (0 < nVars) {
    uVar17 = uVar16;
    if ((int)uVar16 < 2) {
      uVar17 = 1;
    }
    uVar3 = (ulong)(uint)(0 << bVar5);
    do {
      if (nVars < 7) {
        if ((s_Truths6Neg[uVar3] &
            (local_2038[0] >> ((byte)(1 << ((byte)uVar3 & 0x1f)) & 0x3f) ^ local_2038[0])) == 0)
        goto LAB_00514a70;
      }
      else {
        if (5 < uVar3) {
          if (iVar8 != 0x1f) {
            bVar5 = (byte)(uVar3 - 6);
            uVar9 = 1 << (bVar5 & 0x1f);
            iVar12 = 2 << (bVar5 & 0x1f);
            uVar4 = 1;
            if (1 < (int)uVar9) {
              uVar4 = (ulong)uVar9;
            }
            puVar13 = local_2038 + (int)uVar9;
            puVar14 = local_2038;
            do {
              if (uVar3 - 6 != 0x1f) {
                uVar7 = 0;
                do {
                  if (puVar14[uVar7] != puVar13[uVar7]) goto LAB_005149b6;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
              puVar14 = puVar14 + iVar12;
              puVar13 = puVar13 + iVar12;
            } while (puVar14 < local_2038 + (int)uVar16);
          }
LAB_00514a70:
          __assert_fail("Abc_TtHasVar( p, nVars, v )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                        ,0x1d8,"Vec_Int_t *Dau_DecFindSets_int(word *, int, int **)");
        }
        if (iVar8 == 0x1f) goto LAB_00514a70;
        uVar4 = 0;
        while (((local_2038[uVar4] >> ((byte)(1 << ((byte)uVar3 & 0x1f)) & 0x3f) ^ local_2038[uVar4]
                ) & s_Truths6Neg[uVar3]) == 0) {
          uVar4 = uVar4 + 1;
          if (uVar17 == uVar4) goto LAB_00514a70;
        }
      }
LAB_005149b6:
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar15);
  }
  if (0 < nVars) {
    uVar3 = 0;
    do {
      local_20b8[uVar3] = (int)uVar3;
      local_2078[uVar3] = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar15 != uVar3);
  }
  if (2 < nVars) {
    if ((int)uVar6 < 2) {
      uVar6 = 1;
    }
    uVar3 = 2;
    local_212c = 1;
    local_2120 = 0;
    do {
      if (nVars != 0x1f) {
        iVar12 = (int)uVar3;
        iVar8 = nVars - iVar12;
        uVar17 = 1 << ((byte)uVar3 & 0x1f);
        if ((int)uVar17 < 2) {
          uVar17 = 1;
        }
        uVar4 = 0;
        do {
          uVar16 = (uint)uVar4;
          if (uVar3 == (uint)(Abc_TtBitCount8[uVar16 >> 8] + Abc_TtBitCount8[uVar4 & 0xff])) {
            Dau_DecMoveFreeToLSB(local_2038,nVars,local_2078,local_20b8,uVar16,iVar12);
            memcpy(local_20f8,local_20b8 + (int)((nVars - 2U) - (int)local_2120),local_2120 * 4 + 8)
            ;
            if ((long)(uVar15 - 6) < (long)uVar3) {
              iVar1 = Dau_DecCheckSetTop5(local_2038,nVars,iVar8,iVar12,0,0,pSched[uVar3],
                                          (word *)0x0,(word *)0x0);
            }
            else {
              iVar1 = Dau_DecCheckSetTop6(local_2038,nVars,iVar8,iVar12,0,0,pSched[uVar3],
                                          (word *)0x0,(word *)0x0);
            }
            if (iVar1 == 0) {
              if (2 < uVar3) {
                uVar9 = 1;
                do {
                  if (uVar9 < 4 && uVar3 != 0x1f) {
                    uVar4 = 0;
                    do {
                      uMaskS = (uint)uVar4;
                      if (Abc_TtBitCount8[uVar4 >> 8] + Abc_TtBitCount8[uVar4 & 0xff] == uVar9) {
                        uVar4 = 0;
                        Entry = 0;
                        do {
                          bVar5 = (char)local_20b8[uVar4 - 0x10] * '\x02';
                          uVar11 = 2 << (bVar5 & 0x1f);
                          if ((uMaskS >> ((uint)uVar4 & 0x1f) & 1) == 0) {
                            uVar11 = 0;
                          }
                          Entry = Entry | uVar11 | 1 << (bVar5 & 0x1f);
                          uVar4 = uVar4 + 1;
                        } while (uVar3 != uVar4);
                        if (0 < (long)p_00->nSize) {
                          lVar10 = 0;
                          do {
                            if (((p_00->pArray[lVar10] & ~Entry) == 0) &&
                               (uVar11 = ~p_00->pArray[lVar10] & Entry,
                               (~uVar11 >> 1 & uVar11 & 0x55555555) == 0)) goto LAB_00514d64;
                            lVar10 = lVar10 + 1;
                          } while (p_00->nSize != lVar10);
                        }
                        if ((long)(uVar15 - 6) < (long)uVar3) {
                          iVar1 = Dau_DecCheckSetTop5(local_2038,nVars,iVar8,iVar12,uVar9,uMaskS,
                                                      pSched[uVar3],(word *)0x0,(word *)0x0);
                        }
                        else {
                          iVar1 = Dau_DecCheckSetTop6(local_2038,nVars,iVar8,iVar12,uVar9,uMaskS,
                                                      pSched[uVar3],(word *)0x0,(word *)0x0);
                        }
                        if (iVar1 != 0) {
                          Vec_IntPush(p_00,Entry);
                        }
                      }
LAB_00514d64:
                      uVar4 = (ulong)(uMaskS + 1);
                    } while (uMaskS + 1 != uVar17);
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 != local_212c);
              }
            }
            else {
              uVar4 = 0;
              uVar9 = 0;
              do {
                uVar9 = uVar9 | 1 << ((byte)((char)local_20b8[uVar4 - 0x10] * '\x02') & 0x1f);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
              Vec_IntPush(p_00,uVar9);
            }
          }
          uVar4 = (ulong)(uVar16 + 1);
        } while (uVar16 + 1 != uVar6);
      }
      uVar3 = uVar3 + 1;
      local_2120 = local_2120 + 1;
      local_212c = local_212c + 1;
    } while (local_2120 != nVars - 2U);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Dau_DecFindSets_int( word * pInit, int nVars, int * pSched[16] )
{
    Vec_Int_t * vSets = Vec_IntAlloc( 32 );
    int V2P[16], P2V[16], pVarsB[16];
    int Limit = (1 << nVars);
    int c, v, sizeB, sizeS, maskB, maskS;
    unsigned setMixed;
    word p[1<<10]; 
    memcpy( p, pInit, sizeof(word) * Abc_TtWordNum(nVars) );
    for ( v = 0; v < nVars; v++ )
        assert( Abc_TtHasVar( p, nVars, v ) );
    // initialize permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // iterate through bound sets of each size in increasing order
    for ( sizeB = 2; sizeB < nVars; sizeB++ ) // bound set size
    for ( maskB = 0; maskB < Limit; maskB++ ) // bound set
    if ( Abc_TtBitCount16(maskB) == sizeB )
    {
        // permute variables to have bound set on top
        Dau_DecMoveFreeToLSB( p, nVars, V2P, P2V, maskB, sizeB );
        // collect bound set vars on levels nVars-sizeB to nVars-1
        for ( c = 0; c < sizeB; c++ )
            pVarsB[c] = P2V[nVars-sizeB+c];
        // check disjoint
//        if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, 0, 0, NULL, NULL, NULL) )
        if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, 0, 0, pSched[sizeB], NULL, NULL) )
        {
            Vec_IntPush( vSets, Dau_DecCreateSet(pVarsB, sizeB, 0) );
            continue;
        }
        if ( sizeB == 2 )
            continue;
        // iterate through shared sets of each size in the increasing order
        for ( sizeS = 1; sizeS <= sizeB - 2; sizeS++ )   // shared set size
        if ( sizeS <= 3 )
//        sizeS = 1; 
        for ( maskS = 0; maskS < (1 << sizeB); maskS++ ) // shared set
        if ( Abc_TtBitCount16(maskS) == sizeS )
        {
            setMixed = Dau_DecCreateSet( pVarsB, sizeB, maskS );
//            printf( "Considering %10d ", setMixed );
//            Dau_DecPrintSet( setMixed, nVars );
            // check if it exists
            if ( Dau_DecSetIsContained(vSets, setMixed) )
                continue;
            // check if it can be added
//            if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, NULL, NULL, NULL) )
            if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, pSched[sizeB], NULL, NULL) )
                Vec_IntPush( vSets, setMixed );
        }
    }
    return vSets;
}